

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O3

void __thiscall QHeaderView::mouseMoveEvent(QHeaderView *this,QMouseEvent *e)

{
  Orientation OVar1;
  QHeaderViewPrivate *this_00;
  QAbstractItemModel *pQVar2;
  QObject *pQVar3;
  QWidget *this_01;
  long lVar4;
  QWidgetData *pQVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ResizeMode RVar9;
  LayoutDirection LVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  undefined8 uVar16;
  int iVar17;
  QPoint QVar18;
  long in_FS_OFFSET;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  QStatusTipEvent tip;
  QArrayData *local_a0;
  undefined8 local_98;
  long lStack_90;
  QArrayData *local_88;
  undefined8 uStack_80;
  long local_78;
  anon_union_24_3_e3d07ef4_for_data local_68;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QHeaderViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  OVar1 = this_00->orientation;
  auVar23 = QEventPoint::position();
  dVar21 = auVar23._0_8_;
  if (OVar1 != Horizontal) {
    dVar21 = auVar23._8_8_;
  }
  dVar21 = (double)((ulong)dVar21 & 0x8000000000000000 | (ulong)DAT_006605c0) + dVar21;
  dVar22 = dVar21;
  if (dVar21 <= -2147483648.0) {
    dVar22 = -2147483648.0;
  }
  iVar15 = (int)(double)(-(ulong)(2147483647.0 < dVar21) & 0x41dfffffffc00000 |
                        ~-(ulong)(2147483647.0 < dVar21) & (ulong)dVar22);
  if ((iVar15 < 0) && (this_00->state != SelectSections)) goto switchD_0054dde9_default;
  if (*(int *)(e + 0x44) != 0) {
    switch(this_00->state) {
    case NoState:
      goto switchD_0054dde9_caseD_0;
    case ResizeSection:
      if (this_00->cascadingResizing == true) {
        if ((this_00->orientation == Horizontal) &&
           (LVar10 = QWidget::layoutDirection
                               (*(QWidget **)
                                 &(this_00->super_QAbstractItemViewPrivate).
                                  super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                  super_QWidgetPrivate.field_0x8), LVar10 == RightToLeft)) {
          iVar8 = this_00->lastPos - iVar15;
        }
        else {
          iVar8 = iVar15 - this_00->lastPos;
        }
        uVar12 = visualIndex(this,this_00->section);
        if (this_00->headerMode == InitialNoSectionMemoryUsage) {
          uVar13 = this_00->defaultSectionSize;
        }
        else {
          uVar13 = 0xffffffff;
          if ((-1 < (int)uVar12) && ((int)uVar12 < (int)(this_00->sectionItems).d.size)) {
            uVar13 = *(uint *)((this_00->sectionItems).d.ptr + uVar12) & 0xfffff;
          }
        }
        QHeaderViewPrivate::cascadingResize(this_00,uVar12,uVar13 + iVar8);
      }
      else {
        if ((this_00->orientation == Horizontal) &&
           (LVar10 = QWidget::layoutDirection
                               (*(QWidget **)
                                 &(this_00->super_QAbstractItemViewPrivate).
                                  super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                  super_QWidgetPrivate.field_0x8), LVar10 == RightToLeft)) {
          iVar8 = this_00->firstPos - iVar15;
        }
        else {
          iVar8 = iVar15 - this_00->firstPos;
        }
        iVar14 = minimumSectionSize(this);
        iVar8 = iVar8 + this_00->originalSize;
        iVar11 = *(int *)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                    super_QFrame.super_QWidget.field_0x8 + 0x608);
        iVar17 = 0xfffff;
        if (iVar11 != -1) {
          iVar17 = iVar11;
        }
        if (iVar8 <= iVar17) {
          iVar17 = iVar8;
        }
        if (iVar17 <= iVar14) {
          iVar17 = iVar14;
        }
        resizeSection(this,this_00->section,iVar17);
      }
      this_00->lastPos = iVar15;
      break;
    case MoveSection:
      auVar23 = QEventPoint::position();
      dVar22 = (double)((ulong)auVar23._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar23._0_8_;
      dVar21 = dVar22;
      if (dVar22 <= -2147483648.0) {
        dVar21 = -2147483648.0;
      }
      dVar19 = (double)((ulong)auVar23._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar23._8_8_;
      dVar20 = dVar19;
      if (dVar19 <= -2147483648.0) {
        dVar20 = -2147483648.0;
      }
      local_68.shared =
           (PrivateShared *)
           CONCAT44((int)(double)(-(ulong)(2147483647.0 < dVar19) & 0x41dfffffffc00000 |
                                 ~-(ulong)(2147483647.0 < dVar19) & (ulong)dVar20),
                    (int)(double)(-(ulong)(2147483647.0 < dVar22) & 0x41dfffffffc00000 |
                                 ~-(ulong)(2147483647.0 < dVar22) & (ulong)dVar21));
      bVar7 = QAbstractItemViewPrivate::shouldAutoScroll
                        (&this_00->super_QAbstractItemViewPrivate,(QPoint *)&local_68.shared);
      if (bVar7) {
        auVar23 = QEventPoint::position();
        dVar21 = (double)((ulong)auVar23._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar23._0_8_;
        bVar7 = 2147483647.0 < dVar21;
        if (dVar21 <= -2147483648.0) {
          dVar21 = -2147483648.0;
        }
        dVar22 = (double)((ulong)auVar23._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                 auVar23._8_8_;
        bVar6 = 2147483647.0 < dVar22;
        if (dVar22 <= -2147483648.0) {
          dVar22 = -2147483648.0;
        }
        this_01 = *(QWidget **)
                   &(this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                    super_QFramePrivate.super_QWidgetPrivate.field_0x8;
        LVar10 = QWidget::layoutDirection(this_01);
        iVar11 = (**(code **)(*(long *)this_01 + 0x2b0))(this_01);
        iVar8 = -iVar11;
        if (LVar10 != RightToLeft) {
          iVar8 = iVar11;
        }
        iVar11 = (**(code **)(*(long *)this_01 + 0x2b8))(this_01);
        QVar18.xp.m_i =
             iVar8 + (int)(double)(-(ulong)bVar7 & 0x41dfffffffc00000 |
                                  ~-(ulong)bVar7 & (ulong)dVar21);
        QVar18.yp.m_i =
             iVar11 + (int)(double)(-(ulong)bVar6 & 0x41dfffffffc00000 |
                                   ~-(ulong)bVar6 & (ulong)dVar22);
        (this_00->super_QAbstractItemViewPrivate).draggedPosition = QVar18;
        uVar16 = 50000000;
        if ((this_00->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerItem) {
          uVar16 = 150000000;
        }
        QBasicTimer::start(&(this_00->super_QAbstractItemViewPrivate).autoScrollTimer,uVar16,1,
                           *(undefined8 *)
                            &(this_00->super_QAbstractItemViewPrivate).
                             super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                             super_QWidgetPrivate.field_0x8);
        (this_00->super_QAbstractItemViewPrivate).autoScrollCount = 0;
      }
      iVar11 = iVar15 - this_00->firstPos;
      iVar8 = -iVar11;
      if (0 < iVar11) {
        iVar8 = iVar11;
      }
      iVar11 = QApplication::startDragDistance();
      if (((iVar8 < iVar11) &&
          ((((this_00->sectionIndicator->super_QFrame).super_QWidget.data)->widget_attributes &
           0x10000) != 0)) || (uVar12 = visualIndexAt(this,iVar15), uVar12 == 0xffffffff)) break;
      if (uVar12 == 0) {
        lVar4 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                          super_QWidget.field_0x8;
        if (*(int *)(lVar4 + 0x650) == 0) {
          if (0 < *(int *)(lVar4 + 0x658)) goto LAB_0054e41e;
        }
        else if ((0 < *(int *)(lVar4 + 0x648)) &&
                ((*(long *)(lVar4 + 0x580) == 0 || (**(int **)(lVar4 + 0x578) == 0)))) {
LAB_0054e41e:
          if (this_00->allowUserMoveOfSection0 != true) break;
        }
      }
      iVar8 = QHeaderViewPrivate::headerSectionPosition(this_00,uVar12);
      if (this_00->headerMode == InitialNoSectionMemoryUsage) {
        uVar13 = this_00->defaultSectionSize;
      }
      else {
        uVar13 = 0xffffffff;
        if ((-1 < (int)uVar12) && ((int)uVar12 < (int)(this_00->sectionItems).d.size)) {
          uVar13 = *(uint *)((this_00->sectionItems).d.ptr + uVar12) & 0xfffff;
        }
      }
      iVar11 = this_00->headerOffset;
      iVar17 = iVar15;
      if ((this_00->orientation == Horizontal) &&
         (LVar10 = QWidget::layoutDirection
                             (*(QWidget **)
                               &(this_00->super_QAbstractItemViewPrivate).
                                super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                super_QWidgetPrivate.field_0x8), LVar10 == RightToLeft)) {
        pQVar5 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar17 = ((pQVar5->crect).x2.m_i - ((pQVar5->crect).x1.m_i + iVar15)) + 1;
      }
      iVar11 = (int)uVar13 / 2 + (iVar8 - iVar11);
      iVar8 = visualIndex(this,this_00->section);
      uVar13 = this_00->target;
      if ((int)uVar12 < iVar8) {
        if (iVar11 <= iVar17) {
          uVar12 = uVar12 + 1;
        }
LAB_0054e4ee:
        if ((this_00->logicalIndices).d.size != 0) {
          uVar12 = (this_00->logicalIndices).d.ptr[(int)uVar12];
        }
      }
      else {
        if (iVar8 < (int)uVar12) {
          if (iVar17 <= iVar11) {
            uVar12 = uVar12 - 1;
          }
          goto LAB_0054e4ee;
        }
        uVar12 = this_00->section;
      }
      this_00->target = uVar12;
      if ((uVar13 == 0xffffffff) || (uVar13 != uVar12)) {
        QHeaderViewPrivate::updateSectionsBeforeAfter(this_00,uVar12);
      }
      QHeaderViewPrivate::updateSectionIndicator(this_00,this_00->section,iVar15);
      break;
    case SelectSections:
      iVar8 = -this_00->headerOffset;
      if (-this_00->headerOffset <= iVar15) {
        iVar8 = iVar15;
      }
      uVar12 = logicalIndexAt(this,iVar8);
      if ((0 < iVar15) && (uVar12 == 0xffffffff)) {
        uVar13 = QHeaderViewPrivate::lastVisibleVisualIndex(this_00);
        uVar12 = 0xffffffff;
        if (-1 < (int)uVar13) {
          lVar4 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                            super_QWidget.field_0x8;
          if (*(int *)(lVar4 + 0x650) == 0) {
            uVar12 = 0xffffffff;
            if ((int)uVar13 < *(int *)(lVar4 + 0x658)) {
              uVar12 = uVar13;
            }
          }
          else if (((int)uVar13 < *(int *)(lVar4 + 0x648)) &&
                  (uVar12 = uVar13, *(long *)(lVar4 + 0x580) != 0)) {
            uVar12 = *(uint *)(*(long *)(lVar4 + 0x578) + (ulong)uVar13 * 4);
          }
        }
      }
      uVar13 = this_00->pressed;
      if (uVar12 != uVar13) {
        if (uVar13 != 0xffffffff) {
          updateSection(this,uVar13);
        }
        this_00->pressed = uVar12;
        if ((uVar12 != 0xffffffff) && (this_00->clickableSections != false)) {
          local_68._8_8_ = &local_88;
          local_88 = (QArrayData *)CONCAT44(local_88._4_4_,uVar12);
          local_68.shared = (PrivateShared *)0x0;
          QMetaObject::activate((QObject *)this,&staticMetaObject,4,&local_68.shared);
          updateSection(this,this_00->pressed);
        }
      }
    }
    goto switchD_0054dde9_default;
  }
  this_00->state = NoState;
  this_00->firstPressed = -1;
  this_00->pressed = -1;
switchD_0054dde9_caseD_0:
  iVar8 = QHeaderViewPrivate::sectionHandleAt(this_00,iVar15);
  bVar7 = QWidget::testAttribute_helper((QWidget *)this,WA_SetCursor);
  if ((iVar8 != -1) && (RVar9 = sectionResizeMode(this,iVar8), RVar9 == Interactive)) {
    if (!bVar7) {
      QCursor::QCursor((QCursor *)&local_68.shared,
                       (this_00->orientation == Horizontal) + SplitVCursor);
      QWidget::setCursor((QWidget *)this,(QCursor *)&local_68.shared);
      QCursor::~QCursor((QCursor *)&local_68.shared);
    }
    goto switchD_0054dde9_default;
  }
  if (bVar7) {
    QWidget::unsetCursor((QWidget *)this);
  }
  iVar15 = logicalIndexAt(this,iVar15);
  local_88 = (QArrayData *)0x0;
  uStack_80 = 0;
  local_78 = 0;
  if (iVar15 == -1) {
    if ((this_00->super_QAbstractItemViewPrivate).shouldClearStatusTip == false)
    goto switchD_0054dde9_default;
LAB_0054df2f:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_68._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStatusTipEvent::QStatusTipEvent((QStatusTipEvent *)local_68.data,(QString *)&local_88);
    pQVar3 = *(QObject **)
              &(this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
               super_QFramePrivate.super_QWidgetPrivate.field_0x10;
    if (pQVar3 != (QObject *)0x0) {
      this = (QHeaderView *)pQVar3;
    }
    QCoreApplication::sendEvent((QObject *)this,(QEvent *)local_68.data);
    (this_00->super_QAbstractItemViewPrivate).shouldClearStatusTip = local_78 != 0;
    QStatusTipEvent::~QStatusTipEvent((QStatusTipEvent *)local_68.data);
    local_a0 = local_88;
  }
  else {
    pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
    (**(code **)(*(long *)pQVar2 + 0xa0))(&local_68,pQVar2,iVar15,this_00->orientation,4);
    ::QVariant::toString();
    local_88 = local_a0;
    uStack_80 = local_98;
    local_78 = lStack_90;
    ::QVariant::~QVariant((QVariant *)&local_68);
    if (((this_00->super_QAbstractItemViewPrivate).shouldClearStatusTip != false) ||
       (lStack_90 != 0)) goto LAB_0054df2f;
  }
  if (local_a0 != (QArrayData *)0x0) {
    LOCK();
    (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,0x10);
    }
  }
switchD_0054dde9_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHeaderView::mouseMoveEvent(QMouseEvent *e)
{
    Q_D(QHeaderView);
    const int pos = d->orientation == Qt::Horizontal ? e->position().toPoint().x() : e->position().toPoint().y();
    if (pos < 0 && d->state != QHeaderViewPrivate::SelectSections)
        return;
    if (e->buttons() == Qt::NoButton) {
        // Under Cocoa, when the mouse button is released, may include an extra
        // simulated mouse moved event. The state of the buttons when this event
        // is generated is already "no button" and the code below gets executed
        // just before the mouseReleaseEvent and resets the state. This prevents
        // column dragging from working. So this code is disabled under Cocoa.
        d->state = QHeaderViewPrivate::NoState;
        d->firstPressed = d->pressed = -1;
    }
    switch (d->state) {
        case QHeaderViewPrivate::ResizeSection: {
            Q_ASSERT(d->originalSize != -1);
            if (d->cascadingResizing) {
                int delta = d->reverse() ? d->lastPos - pos : pos - d->lastPos;
                int visual = visualIndex(d->section);
                d->cascadingResize(visual, d->headerSectionSize(visual) + delta);
            } else {
                int delta = d->reverse() ? d->firstPos - pos : pos - d->firstPos;
                int newsize = qBound(minimumSectionSize(), d->originalSize + delta, maximumSectionSize());
                resizeSection(d->section, newsize);
            }
            d->lastPos = pos;
            return;
        }
        case QHeaderViewPrivate::MoveSection: {
            if (d->shouldAutoScroll(e->position().toPoint())) {
                d->draggedPosition = e->pos() + d->offset();
                d->startAutoScroll();
            }
            if (qAbs(pos - d->firstPos) >= QApplication::startDragDistance()
#if QT_CONFIG(label)
                || !d->sectionIndicator->isHidden()
#endif
                ) {
                int visual = visualIndexAt(pos);
                if (visual == -1)
                    return;
                if (visual == 0 && logicalIndex(0) == 0 && !d->allowUserMoveOfSection0)
                    return;

                const int posThreshold = d->headerSectionPosition(visual) - d->headerOffset + d->headerSectionSize(visual) / 2;
                const int checkPos = d->reverse() ? d->viewport->width() - pos : pos;
                int moving = visualIndex(d->section);
                int oldTarget = d->target;
                if (visual < moving) {
                    if (checkPos < posThreshold)
                        d->target = d->logicalIndex(visual);
                    else
                        d->target = d->logicalIndex(visual + 1);
                } else if (visual > moving) {
                    if (checkPos > posThreshold)
                        d->target = d->logicalIndex(visual);
                    else
                        d->target = d->logicalIndex(visual - 1);
                } else {
                    d->target = d->section;
                }
                if (oldTarget != d->target || oldTarget == -1)
                    d->updateSectionsBeforeAfter(d->target);
                d->updateSectionIndicator(d->section, pos);
            }
            return;
        }
        case QHeaderViewPrivate::SelectSections: {
            int logical = logicalIndexAt(qMax(-d->headerOffset, pos));
            if (logical == -1 && pos > 0)
                logical = logicalIndex(d->lastVisibleVisualIndex());
            if (logical == d->pressed)
                return; // nothing to do
            else if (d->pressed != -1)
                updateSection(d->pressed);
            d->pressed = logical;
            if (d->clickableSections && logical != -1) {
                emit sectionEntered(d->pressed);
                updateSection(d->pressed);
            }
            return;
        }
        case QHeaderViewPrivate::NoState: {
#ifndef QT_NO_CURSOR
            int handle = d->sectionHandleAt(pos);
            bool hasCursor = testAttribute(Qt::WA_SetCursor);
            if (handle != -1 && (sectionResizeMode(handle) == Interactive)) {
                if (!hasCursor)
                    setCursor(d->orientation == Qt::Horizontal ? Qt::SplitHCursor : Qt::SplitVCursor);
            } else {
                if (hasCursor)
                    unsetCursor();
#ifndef QT_NO_STATUSTIP
                int logical = logicalIndexAt(pos);
                QString statusTip;
                if (logical != -1)
                    statusTip = d->model->headerData(logical, d->orientation, Qt::StatusTipRole).toString();
                if (d->shouldClearStatusTip || !statusTip.isEmpty()) {
                    QStatusTipEvent tip(statusTip);
                    QCoreApplication::sendEvent(d->parent ? d->parent : this, &tip);
                    d->shouldClearStatusTip = !statusTip.isEmpty();
                }
#endif // !QT_NO_STATUSTIP
            }
#endif
            return;
        }
        default:
            break;
    }
}